

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  bool bVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  float fVar24;
  Mat mins;
  Mat local_78;
  
  sVar2 = a->elemsize;
  iVar23 = a->dims;
  if (iVar23 == 3) {
    uVar10 = a->w;
    uVar13 = (ulong)uVar10;
    uVar9 = a->h;
    uVar17 = (ulong)uVar9;
    uVar8 = a->c;
    uVar16 = (ulong)uVar8;
    uVar15 = uVar9 * uVar10;
    bVar20 = !reduce_w;
    bVar7 = !reduce_h;
    if ((bVar20 || bVar7) || !reduce_c) {
      if ((!bVar20 && !bVar7) && !reduce_c) {
        Mat::create(b,1,1,uVar8,sVar2,opt->blob_allocator);
        if (0 < (int)uVar8) {
          pvVar11 = a->data;
          sVar2 = a->cstep;
          pvVar14 = b->data;
          sVar3 = b->cstep;
          sVar4 = b->elemsize;
          sVar5 = a->elemsize;
          uVar13 = 0;
          do {
            fVar24 = 0.0;
            if (0 < (int)uVar15) {
              uVar17 = 0;
              do {
                fVar1 = *(float *)((long)pvVar11 + uVar17 * 4);
                fVar24 = fVar24 + fVar1 * fVar1;
                uVar17 = uVar17 + 1;
              } while (uVar15 != uVar17);
            }
            *(float *)((long)pvVar14 + sVar3 * sVar4 * uVar13) = fVar24;
            uVar13 = uVar13 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar5);
          } while (uVar13 != uVar16);
          return 0;
        }
        return 0;
      }
      lVar12 = (long)(int)uVar10;
      if ((!bVar20 && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar9,uVar8,sVar2,opt->blob_allocator);
        if (0 < (int)uVar8) {
          pvVar11 = a->data;
          sVar2 = a->cstep;
          sVar3 = b->cstep;
          sVar4 = b->elemsize;
          sVar5 = a->elemsize;
          pvVar14 = b->data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              pvVar19 = pvVar11;
              do {
                fVar24 = 0.0;
                if (0 < (int)uVar10) {
                  uVar22 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar19 + uVar22 * 4);
                    fVar24 = fVar24 + fVar1 * fVar1;
                    uVar22 = uVar22 + 1;
                  } while (uVar13 != uVar22);
                }
                *(float *)((long)pvVar14 + uVar21 * 4 + sVar3 * sVar4 * uVar18) = fVar24;
                uVar21 = uVar21 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
              } while (uVar21 != uVar17);
            }
            uVar18 = uVar18 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar5);
          } while (uVar18 != uVar16);
          return 0;
        }
        return 0;
      }
      if ((!bVar20 && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar9,1,sVar2,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,1,uVar9,uVar8,sVar2,opt->workspace_allocator);
        pvVar11 = local_78.data;
        iVar23 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_001ffa4e;
        uVar15 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar15) {
          memset(local_78.data,0,(ulong)uVar15 << 2);
        }
        if (0 < (int)uVar8) {
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          pvVar14 = a->data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar21 = 0;
              pvVar19 = pvVar14;
              do {
                fVar24 = 0.0;
                if (0 < (int)uVar10) {
                  uVar22 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar19 + uVar22 * 4);
                    fVar24 = fVar24 + fVar1 * fVar1;
                    uVar22 = uVar22 + 1;
                  } while (uVar13 != uVar22);
                }
                *(float *)((long)pvVar11 +
                          uVar21 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * uVar18)
                     = fVar24;
                uVar21 = uVar21 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
              } while (uVar21 != uVar17);
            }
            uVar18 = uVar18 + 1;
            pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
          } while (uVar18 != uVar16);
        }
        uVar10 = b->c * (int)b->cstep;
        if (0 < (int)uVar10) {
          memset(b->data,0,(ulong)uVar10 << 2);
        }
        if (0 < (int)uVar8) {
          pvVar11 = b->data;
          uVar13 = 0;
          pvVar14 = local_78.data;
          do {
            if (0 < (int)uVar9) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar11 + uVar18 * 4) =
                     *(float *)((long)pvVar14 + uVar18 * 4) + *(float *)((long)pvVar11 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar13 = uVar13 + 1;
            pvVar14 = (void *)((long)pvVar14 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar13 != uVar16);
        }
      }
      else {
        if ((bVar7 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar10,uVar9,1,sVar2,opt->blob_allocator);
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < (int)uVar8) {
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              pvVar11 = a->data;
              pvVar14 = b->data;
              uVar13 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar17 = 0;
                  do {
                    fVar24 = *(float *)((long)pvVar11 + uVar17 * 4);
                    *(float *)((long)pvVar14 + uVar17 * 4) =
                         fVar24 * fVar24 + *(float *)((long)pvVar14 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar15 != uVar17);
                }
                uVar13 = uVar13 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
              } while (uVar13 != uVar16);
              return 0;
            }
            return 0;
          }
          if ((bVar7 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar10,1,uVar8,sVar2,opt->blob_allocator);
          sVar2 = b->cstep;
          uVar15 = b->c * (int)sVar2;
          if (0 < (int)uVar15) {
            memset(b->data,0,(ulong)uVar15 << 2);
          }
          if (0 < (int)uVar8) {
            pvVar11 = a->data;
            sVar3 = a->cstep;
            pvVar14 = b->data;
            sVar4 = a->elemsize;
            sVar5 = b->elemsize;
            uVar17 = 0;
            do {
              if (0 < (int)uVar9) {
                uVar8 = 0;
                pvVar19 = pvVar11;
                do {
                  if (0 < (int)uVar10) {
                    uVar18 = 0;
                    do {
                      fVar24 = *(float *)((long)pvVar19 + uVar18 * 4);
                      *(float *)((long)pvVar14 + uVar18 * 4) =
                           fVar24 * fVar24 + *(float *)((long)pvVar14 + uVar18 * 4);
                      uVar18 = uVar18 + 1;
                    } while (uVar13 != uVar18);
                  }
                  uVar8 = uVar8 + 1;
                  pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
                } while (uVar8 != uVar9);
              }
              uVar17 = uVar17 + 1;
              pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
              pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar5);
            } while (uVar17 != uVar16);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar10,1,1,sVar2,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,uVar10,1,uVar8,sVar2,opt->workspace_allocator);
        pvVar11 = local_78.data;
        iVar23 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_001ffa4e;
        uVar15 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar15) {
          memset(local_78.data,0,(ulong)uVar15 << 2);
        }
        if (0 < (int)uVar8) {
          pvVar14 = a->data;
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar15 = 0;
              pvVar19 = pvVar14;
              do {
                if (0 < (int)uVar10) {
                  uVar18 = 0;
                  do {
                    fVar24 = *(float *)((long)pvVar19 + uVar18 * 4);
                    *(float *)((long)pvVar11 + uVar18 * 4) =
                         fVar24 * fVar24 + *(float *)((long)pvVar11 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar13 != uVar18);
                }
                uVar15 = uVar15 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar12 * 4);
              } while (uVar15 != uVar9);
            }
            uVar17 = uVar17 + 1;
            pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
            pvVar11 = (void *)((long)pvVar11 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar17 != uVar16);
        }
        uVar9 = b->c * (int)b->cstep;
        if (0 < (int)uVar9) {
          memset(b->data,0,(ulong)uVar9 << 2);
        }
        if (0 < (int)uVar8) {
          pvVar11 = b->data;
          uVar17 = 0;
          pvVar14 = local_78.data;
          do {
            if (0 < (int)uVar10) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar11 + uVar18 * 4) =
                     *(float *)((long)pvVar14 + uVar18 * 4) + *(float *)((long)pvVar11 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar13 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar14 = (void *)((long)pvVar14 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar17 != uVar16);
        }
      }
      iVar23 = 0;
LAB_001ffa4e:
      Mat::~Mat(&local_78);
      return iVar23;
    }
    Mat::create(b,1,1,1,sVar2,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar8,sVar2,opt->workspace_allocator);
    iVar23 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if ((int)uVar8 < 1) {
LAB_001ff6db:
        fVar24 = 0.0;
      }
      else {
        pvVar11 = a->data;
        sVar2 = a->cstep;
        sVar3 = a->elemsize;
        uVar13 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar15) {
            uVar17 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar17 * 4);
              fVar24 = fVar24 + fVar1 * fVar1;
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
          *(float *)((long)local_78.data + uVar13 * 4) = fVar24;
          uVar13 = uVar13 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
        } while (uVar13 != uVar16);
        if ((int)uVar8 < 1) goto LAB_001ff6db;
        fVar24 = 0.0;
        uVar13 = 0;
        do {
          fVar24 = fVar24 + *(float *)((long)local_78.data + uVar13 * 4);
          uVar13 = uVar13 + 1;
        } while (uVar16 != uVar13);
      }
      *(float *)b->data = fVar24;
      iVar23 = 0;
    }
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar6 == (int *)0x0) {
      return iVar23;
    }
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 != 0) {
      return iVar23;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return iVar23;
    }
    goto LAB_001ff719;
  }
  if (iVar23 != 2) {
    if (iVar23 == 1) {
      iVar23 = a->w;
      Mat::create(b,1,sVar2,opt->blob_allocator);
      if ((long)iVar23 < 1) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = 0.0;
        lVar12 = 0;
        do {
          fVar1 = *(float *)((long)a->data + lVar12 * 4);
          fVar24 = fVar24 + fVar1 * fVar1;
          lVar12 = lVar12 + 1;
        } while (iVar23 != lVar12);
      }
      *(float *)b->data = fVar24;
      return 0;
    }
    return 0;
  }
  uVar10 = a->w;
  uVar13 = (ulong)uVar10;
  uVar9 = a->h;
  uVar16 = (ulong)uVar9;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,1,uVar9,sVar2,opt->blob_allocator);
      if (0 < (int)uVar9) {
        pvVar11 = a->data;
        iVar23 = a->w;
        sVar2 = a->elemsize;
        pvVar14 = b->data;
        uVar17 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar10) {
            uVar18 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar18 * 4);
              fVar24 = fVar24 + fVar1 * fVar1;
              uVar18 = uVar18 + 1;
            } while (uVar13 != uVar18);
          }
          *(float *)((long)pvVar14 + uVar17 * 4) = fVar24;
          uVar17 = uVar17 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar23 * sVar2);
        } while (uVar17 != uVar16);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar10,1,sVar2,opt->blob_allocator);
    uVar8 = b->c * (int)b->cstep;
    if (0 < (int)uVar8) {
      memset(b->data,0,(ulong)uVar8 << 2);
    }
    if (0 < (int)uVar9) {
      pvVar11 = a->data;
      iVar23 = a->w;
      sVar2 = a->elemsize;
      pvVar14 = b->data;
      uVar17 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar18 = 0;
          do {
            fVar24 = *(float *)((long)pvVar11 + uVar18 * 4);
            *(float *)((long)pvVar14 + uVar18 * 4) =
                 fVar24 * fVar24 + *(float *)((long)pvVar14 + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar13 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar23 * sVar2);
      } while (uVar17 != uVar16);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,1,sVar2,opt->blob_allocator);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,uVar9,sVar2,opt->workspace_allocator);
  iVar23 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if ((int)uVar9 < 1) {
LAB_001ff69c:
      fVar24 = 0.0;
    }
    else {
      pvVar11 = a->data;
      iVar23 = a->w;
      sVar2 = a->elemsize;
      uVar17 = 0;
      do {
        fVar24 = 0.0;
        if (0 < (int)uVar10) {
          uVar18 = 0;
          do {
            fVar1 = *(float *)((long)pvVar11 + uVar18 * 4);
            fVar24 = fVar24 + fVar1 * fVar1;
            uVar18 = uVar18 + 1;
          } while (uVar13 != uVar18);
        }
        *(float *)((long)local_78.data + uVar17 * 4) = fVar24;
        uVar17 = uVar17 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar23 * sVar2);
      } while (uVar17 != uVar16);
      if ((int)uVar9 < 1) goto LAB_001ff69c;
      fVar24 = 0.0;
      uVar13 = 0;
      do {
        fVar24 = fVar24 + *(float *)((long)local_78.data + uVar13 * 4);
        uVar13 = uVar13 + 1;
      } while (uVar16 != uVar13);
    }
    *(float *)b->data = fVar24;
    iVar23 = 0;
  }
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar6 == (int *)0x0) {
    return iVar23;
  }
  LOCK();
  *piVar6 = *piVar6 + -1;
  UNLOCK();
  if (*piVar6 != 0) {
    return iVar23;
  }
  if (local_78.allocator != (Allocator *)0x0) {
    (*(local_78.allocator)->_vptr_Allocator[3])();
    return iVar23;
  }
LAB_001ff719:
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
  return iVar23;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}